

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

void __thiscall
sophia_interface::LUROBO
          (sophia_interface *this,double THE,double PHI,double BEX,double BEY,double BEZ)

{
  int local_40;
  int iStack_3c;
  bool skip;
  int IMAX;
  int IMIN;
  double BEZ_local;
  double BEY_local;
  double BEX_local;
  double PHI_local;
  double THE_local;
  sophia_interface *this_local;
  
  iStack_3c = 1;
  if (MSTU[0] < 0) {
    iStack_3c = MSTU[0];
  }
  local_40 = this->N;
  if (MSTU[1] < 0) {
    local_40 = MSTU[1];
  }
  LUDBRB(this,iStack_3c,local_40,THE,PHI,BEX,BEY,BEZ,true);
  return;
}

Assistant:

void sophia_interface::LUROBO(double THE, double PHI, double BEX, double BEY, double BEZ) {
// Purpose: to perform rotations and boosts.
    // Find range of rotation/boost. Convert boost to double precision.
    int IMIN = 1;
    if (MSTU[0] < 0) IMIN = MSTU[0];
    int IMAX = N;
    if (MSTU[1] < 0) IMAX = MSTU[1];
    bool skip = true;
    LUDBRB(IMIN, IMAX, THE, PHI, BEX, BEY, BEZ, skip);
}